

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O0

int enet_host_service(ENetHost *host,ENetEvent *event,enet_uint32 timeout)

{
  enet_uint32 eVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  enet_uint32 eVar5;
  int iVar6;
  int in_EDX;
  undefined4 *in_RSI;
  enet_uint32 *in_RDI;
  int in_stack_0000000c;
  ENetEvent *in_stack_00000010;
  ENetHost *in_stack_00000018;
  ENetHost *in_stack_00000020;
  enet_uint32 waitCondition;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffdc;
  int local_4;
  
  if (in_RSI != (undefined4 *)0x0) {
    *in_RSI = 0;
    *(undefined8 *)(in_RSI + 2) = 0;
    *(undefined8 *)(in_RSI + 6) = 0;
    in_stack_ffffffffffffffdc =
         enet_protocol_dispatch_incoming_commands
                   ((ENetHost *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                    (ENetEvent *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    if (in_stack_ffffffffffffffdc == -1) {
      return -1;
    }
    if (in_stack_ffffffffffffffdc == 1) {
      return 1;
    }
  }
  eVar1 = enet_time_get();
  in_RDI[0x10] = eVar1;
  eVar1 = in_RDI[0x10];
  if (in_RDI[0x10] - in_RDI[5] < 86400000) {
    uVar2 = in_RDI[0x10] - in_RDI[5];
  }
  else {
    uVar2 = in_RDI[5] - in_RDI[0x10];
  }
  if (999 < uVar2) {
    enet_host_bandwidth_throttle(in_stack_00000020);
  }
  iVar3 = enet_protocol_send_outgoing_commands
                    (in_stack_00000018,in_stack_00000010,in_stack_0000000c);
  if (iVar3 == -1) {
    local_4 = -1;
  }
  else if (iVar3 == 1) {
    local_4 = 1;
  }
  else {
    iVar3 = enet_protocol_receive_incoming_commands
                      ((ENetHost *)CONCAT44(in_stack_ffffffffffffffdc,uVar2),
                       (ENetEvent *)CONCAT44(iVar3,in_stack_ffffffffffffffd0));
    if (iVar3 == -1) {
      local_4 = -1;
    }
    else if (iVar3 == 1) {
      local_4 = 1;
    }
    else {
      iVar4 = enet_protocol_send_outgoing_commands
                        (in_stack_00000018,in_stack_00000010,in_stack_0000000c);
      if (iVar4 == -1) {
        local_4 = -1;
      }
      else if (iVar4 == 1) {
        local_4 = 1;
      }
      else {
        if (in_RSI != (undefined4 *)0x0) {
          in_stack_ffffffffffffffc8 =
               enet_protocol_dispatch_incoming_commands
                         ((ENetHost *)CONCAT44(iVar4,in_stack_ffffffffffffffc8),
                          (ENetEvent *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                         );
          if (in_stack_ffffffffffffffc8 == -1) {
            return -1;
          }
          if (in_stack_ffffffffffffffc8 == 1) {
            return 1;
          }
        }
        if (in_RDI[0x10] - (eVar1 + in_EDX) < 86400000) {
          local_4 = 0;
        }
        else {
          do {
            eVar5 = enet_time_get();
            in_RDI[0x10] = eVar5;
            if (in_RDI[0x10] - (eVar1 + in_EDX) < 86400000) {
              return 0;
            }
            iVar6 = enet_socket_wait(iVar3,(enet_uint32 *)CONCAT44(iVar4,in_stack_ffffffffffffffc8),
                                     *in_RDI);
          } while (iVar6 == 0);
          local_4 = -1;
        }
      }
    }
  }
  return local_4;
}

Assistant:

int
enet_host_service (ENetHost * host, ENetEvent * event, enet_uint32 timeout)
{
    enet_uint32 waitCondition;

    if (event != NULL)
    {
        event -> type = ENET_EVENT_TYPE_NONE;
        event -> peer = NULL;
        event -> packet = NULL;

        switch (enet_protocol_dispatch_incoming_commands (host, event))
        {
        case 1:
            return 1;

        case -1:
#ifdef ENET_DEBUG
            perror ("Error dispatching incoming packets");
#endif

            return -1;

        default:
            break;
        }
    }

    host -> serviceTime = enet_time_get ();
    
    timeout += host -> serviceTime;

    do
    {
       if (ENET_TIME_DIFFERENCE (host -> serviceTime, host -> bandwidthThrottleEpoch) >= ENET_HOST_BANDWIDTH_THROTTLE_INTERVAL)
         enet_host_bandwidth_throttle (host);

       switch (enet_protocol_send_outgoing_commands (host, event, 1))
       {
       case 1:
          return 1;

       case -1:
#ifdef ENET_DEBUG
          perror ("Error sending outgoing packets");
#endif

          return -1;

       default:
          break;
       }

       switch (enet_protocol_receive_incoming_commands (host, event))
       {
       case 1:
          return 1;

       case -1:
#ifdef ENET_DEBUG
          perror ("Error receiving incoming packets");
#endif

          return -1;

       default:
          break;
       }

       switch (enet_protocol_send_outgoing_commands (host, event, 1))
       {
       case 1:
          return 1;

       case -1:
#ifdef ENET_DEBUG
          perror ("Error sending outgoing packets");
#endif

          return -1;

       default:
          break;
       }

       if (event != NULL)
       {
          switch (enet_protocol_dispatch_incoming_commands (host, event))
          {
          case 1:
             return 1;

          case -1:
#ifdef ENET_DEBUG
             perror ("Error dispatching incoming packets");
#endif

             return -1;

          default:
             break;
          }
       }

       if (ENET_TIME_GREATER_EQUAL (host -> serviceTime, timeout))
         return 0;

       do
       {
          host -> serviceTime = enet_time_get ();

          if (ENET_TIME_GREATER_EQUAL (host -> serviceTime, timeout))
            return 0;

          waitCondition = ENET_SOCKET_WAIT_RECEIVE | ENET_SOCKET_WAIT_INTERRUPT;

          if (enet_socket_wait (host -> socket, & waitCondition, ENET_TIME_DIFFERENCE (timeout, host -> serviceTime)) != 0)
            return -1;
       }
       while (waitCondition & ENET_SOCKET_WAIT_INTERRUPT);

       host -> serviceTime = enet_time_get ();
    } while (waitCondition & ENET_SOCKET_WAIT_RECEIVE);

    return 0; 
}